

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

char * helicsQueryExecute(HelicsQuery query,HelicsFederate fed,HelicsError *err)

{
  Federate *this;
  char *pcVar1;
  undefined8 *puVar2;
  bool bVar3;
  string_view queryStr;
  string_view target;
  string_view queryStr_00;
  string local_38;
  
  this = getFed(fed,err);
  if (this == (Federate *)0x0) {
    return 
    "{{\n  \"error\":{{\n    \"code\":404,\n    \"message\":\"federate object is not valid\"\n  }}\n}}"
    ;
  }
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (query == (HelicsQuery)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_0019b468;
    }
    else {
      bVar3 = *(int *)((long)query + 0x7c) == 0x27063885;
      puVar2 = (undefined8 *)0x0;
      if (bVar3) {
        puVar2 = (undefined8 *)query;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_0019b46b;
    }
    err->error_code = -3;
    err->message = "Query object is invalid";
  }
LAB_0019b468:
  puVar2 = (undefined8 *)0x0;
LAB_0019b46b:
  if (puVar2 == (undefined8 *)0x0) {
    pcVar1 = 
    "{{\n  \"error\":{{\n    \"code\":400,\n    \"message\":\"query object is not valid\"\n  }}\n}}"
    ;
  }
  else {
    if (puVar2[1] == 0) {
      queryStr._M_str = (char *)puVar2[4];
      queryStr._M_len = puVar2[5];
      helics::Federate::query_abi_cxx11_
                (&local_38,this,queryStr,*(HelicsSequencingModes *)((long)puVar2 + 0x74));
    }
    else {
      target._M_str = (char *)*puVar2;
      target._M_len = puVar2[1];
      queryStr_00._M_str = (char *)puVar2[4];
      queryStr_00._M_len = puVar2[5];
      helics::Federate::query_abi_cxx11_
                (&local_38,this,target,queryStr_00,*(HelicsSequencingModes *)((long)puVar2 + 0x74));
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 8),
               &local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (char *)puVar2[8];
  }
  return pcVar1;
}

Assistant:

const char* helicsQueryExecute(HelicsQuery query, HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return invalidFedObConst;
    }

    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return invalidQueryObConst;
    }
    try {
        if (queryObj->target.empty()) {
            queryObj->response = fedObj->query(queryObj->query, queryObj->mode);
        } else {
            queryObj->response = fedObj->query(queryObj->target, queryObj->query, queryObj->mode);
        }

        return queryObj->response.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    return queryErrorString;
    // LCOV_EXCL_START
}